

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

AliHttpRequest * __thiscall
AliHttpRequest::AddRequestQuery(AliHttpRequest *this,string *field,string *value)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  string *local_20;
  string *value_local;
  string *field_local;
  AliHttpRequest *this_local;
  
  local_20 = value;
  value_local = field;
  field_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::append((char *)&this->query_);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)field);
  urlencode(&local_40,&local_60);
  uVar2 = std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)&local_b0,(string *)value);
  urlencode(&local_90,&local_b0);
  uVar3 = std::__cxx11::string::c_str();
  append_format_string(&this->query_,"%s=%s",uVar2,uVar3);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

AliHttpRequest& AliHttpRequest::AddRequestQuery(std::string field, std::string value) {
  if(!this->query_.empty()) {
    query_.append("&");
  }
  append_format_string(query_, "%s=%s", urlencode(field).c_str(),  urlencode(value).c_str());
  return *this;
}